

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

lua_Unsigned luaH_getn(Table *t)

{
  byte bVar1;
  TValue *pTVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  lua_Unsigned lVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  
  uVar8 = t->alimit;
  lVar6 = (lua_Unsigned)uVar8;
  if (lVar6 != 0) {
    pTVar2 = t->array;
    uVar11 = uVar8 - 1;
    uVar9 = (ulong)uVar11;
    if ((pTVar2[uVar9].tt_ & 0xf) == 0) {
      uVar4 = 0;
      if (uVar8 != 1) {
        uVar4 = uVar8 - 2;
        if ((pTVar2[uVar4].tt_ & 0xf) != 0) {
          if ((char)t->flags < '\0') {
            if ((uVar11 & uVar4) == 0) {
              return uVar9;
            }
          }
          else if ((uVar11 & uVar4) == 0 || (uVar8 & uVar11) != 0) {
            return uVar9;
          }
          t->alimit = uVar11;
          t->flags = t->flags | 0x80;
          return uVar9;
        }
        uVar4 = 0;
        do {
          uVar11 = (int)lVar6 + uVar4 >> 1;
          if ((pTVar2[uVar11 - 1].tt_ & 0xf) == 0) {
            lVar6 = (lua_Unsigned)uVar11;
            uVar11 = uVar4;
          }
          uVar4 = uVar11;
        } while (1 < (int)lVar6 - uVar4);
      }
      bVar1 = t->flags;
      if ((((char)bVar1 < '\0') ||
          (uVar8 = uVar8 - (uVar8 >> 1 & 0x55555555),
          uVar8 = (uVar8 >> 2 & 0x33333333) + (uVar8 & 0x33333333),
          ((uVar8 >> 4) + uVar8 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2)) &&
         (uVar8 = luaH_realasize(t), uVar8 >> 1 < uVar4)) {
        t->alimit = uVar4;
        t->flags = bVar1 | 0x80;
      }
      return (ulong)uVar4;
    }
  }
  if (((char)t->flags < '\0') &&
     (uVar11 = uVar8 - (uVar8 >> 1 & 0x55555555),
     uVar11 = (uVar11 >> 2 & 0x33333333) + (uVar11 & 0x33333333),
     1 < ((uVar11 >> 4) + uVar11 & 0xf0f0f0f) * 0x1010101 >> 0x18)) {
    pTVar2 = t->array;
    if ((pTVar2[lVar6].tt_ & 0xf) == 0) {
      return lVar6;
    }
    uVar11 = luaH_realasize(t);
    if ((pTVar2[uVar11 - 1].tt_ & 0xf) == 0) {
      uVar4 = uVar11 - uVar8;
      while (1 < uVar4) {
        uVar5 = uVar11 + (int)lVar6 >> 1;
        if ((pTVar2[uVar5 - 1].tt_ & 0xf) != 0) {
          lVar6 = (lua_Unsigned)uVar5;
          uVar5 = uVar11;
        }
        uVar8 = (uint)lVar6;
        uVar11 = uVar5;
        uVar4 = uVar5 - uVar8;
      }
      t->alimit = uVar8;
      return lVar6;
    }
    lVar6 = (lua_Unsigned)uVar11;
  }
  iVar7 = (int)lVar6;
  if ((t->lastfree != (Node *)0x0) &&
     (pTVar2 = luaH_getint(t,(ulong)(iVar7 + 1)), (pTVar2->tt_ & 0xf) != 0)) {
    uVar9 = (ulong)(iVar7 + (uint)(iVar7 == 0));
    do {
      lVar6 = uVar9;
      if (lVar6 >> 0x3e != 0) {
        uVar9 = 0x7fffffffffffffff;
        pTVar2 = luaH_getint(t,0x7fffffffffffffff);
        if ((pTVar2->tt_ & 0xf) != 0) {
          return 0x7fffffffffffffff;
        }
        break;
      }
      uVar9 = lVar6 * 2;
      pTVar2 = luaH_getint(t,uVar9);
    } while ((pTVar2->tt_ & 0xf) != 0);
    uVar3 = uVar9 - lVar6;
    while (1 < uVar3) {
      uVar3 = uVar9 + lVar6 >> 1;
      pTVar2 = luaH_getint(t,uVar3);
      uVar10 = uVar3;
      if ((pTVar2->tt_ & 0xf) != 0) {
        uVar10 = uVar9;
        lVar6 = uVar3;
      }
      uVar9 = uVar10;
      uVar3 = uVar10 - lVar6;
    }
  }
  return lVar6;
}

Assistant:

lua_Unsigned luaH_getn (Table *t) {
  unsigned int limit = t->alimit;
  if (limit > 0 && isempty(&t->array[limit - 1])) {  /* (1)? */
    /* there must be a boundary before 'limit' */
    if (limit >= 2 && !isempty(&t->array[limit - 2])) {
      /* 'limit - 1' is a boundary; can it be a new limit? */
      if (ispow2realasize(t) && !ispow2(limit - 1)) {
        t->alimit = limit - 1;
        setnorealasize(t);  /* now 'alimit' is not the real size */
      }
      return limit - 1;
    }
    else {  /* must search for a boundary in [0, limit] */
      unsigned int boundary = binsearch(t->array, 0, limit);
      /* can this boundary represent the real size of the array? */
      if (ispow2realasize(t) && boundary > luaH_realasize(t) / 2) {
        t->alimit = boundary;  /* use it as the new limit */
        setnorealasize(t);
      }
      return boundary;
    }
  }
  /* 'limit' is zero or present in table */
  if (!limitequalsasize(t)) {  /* (2)? */
    /* 'limit' > 0 and array has more elements after 'limit' */
    if (isempty(&t->array[limit]))  /* 'limit + 1' is empty? */
      return limit;  /* this is the boundary */
    /* else, try last element in the array */
    limit = luaH_realasize(t);
    if (isempty(&t->array[limit - 1])) {  /* empty? */
      /* there must be a boundary in the array after old limit,
         and it must be a valid new limit */
      unsigned int boundary = binsearch(t->array, t->alimit, limit);
      t->alimit = boundary;
      return boundary;
    }
    /* else, new limit is present in the table; check the hash part */
  }
  /* (3) 'limit' is the last element and either is zero or present in table */
  lua_assert(limit == luaH_realasize(t) &&
             (limit == 0 || !isempty(&t->array[limit - 1])));
  if (isdummy(t) || isempty(luaH_getint(t, cast(lua_Integer, limit + 1))))
    return limit;  /* 'limit + 1' is absent */
  else  /* 'limit + 1' is also present */
    return hash_search(t, limit);
}